

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O1

void __thiscall ASDCP::MXF::OPAtomIndexFooter::Dump(OPAtomIndexFooter *this,FILE *stream)

{
  PacketList *pPVar1;
  long *plVar2;
  PacketList *pPVar3;
  
  if (stream == (FILE *)0x0) {
    stream = _stderr;
  }
  Partition::Dump(&this->super_Partition,stream);
  pPVar1 = (this->super_Partition).m_PacketList.m_p;
  pPVar3 = (PacketList *)
           (pPVar1->m_List).
           super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (pPVar3 != pPVar1) {
    do {
      plVar2 = (long *)(pPVar3->m_List).
                       super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                       ._M_impl._M_node._M_size;
      (**(code **)(*plVar2 + 0x88))(plVar2,stream);
      pPVar3 = (PacketList *)
               (pPVar3->m_List).
               super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
               ._M_impl._M_node.super__List_node_base._M_next;
    } while (pPVar3 != (this->super_Partition).m_PacketList.m_p);
  }
  return;
}

Assistant:

void
ASDCP::MXF::OPAtomIndexFooter::Dump(FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  Partition::Dump(stream);

  std::list<InterchangeObject*>::iterator i = m_PacketList->m_List.begin();
  for ( ; i != m_PacketList->m_List.end(); i++ )
    (*i)->Dump(stream);
}